

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.c
# Opt level: O3

int forward_dns_request(sockaddr *dest_addr,socklen_t dest_len,void *data,size_t len)

{
  int __fd;
  int iVar1;
  void *pvVar2;
  undefined4 in_register_00000034;
  int priority;
  char *fmt;
  
  __fd = socket((uint)dest_addr->sa_family,2,0x11);
  if (__fd == -1) {
    _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0x210,
               "forward_dns_request",1,3,"socket");
    return -1;
  }
  iVar1 = evutil_make_socket_nonblocking(__fd);
  if (iVar1 == 0) {
    pvVar2 = (void *)sendto(__fd,(void *)CONCAT44(in_register_00000034,dest_len),(size_t)data,0,
                            (sockaddr *)dest_addr,0x80);
    if (pvVar2 != (void *)0xffffffffffffffff) {
      if (pvVar2 == data) {
        return __fd;
      }
      _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0x220
                 ,"forward_dns_request",0,7,
                 "sendto: I was sending %zd bytes, but only %zd were sent.",data,pvVar2);
      goto LAB_00106be9;
    }
    fmt = "sendto: Can\'t forward packet";
    iVar1 = 0x21c;
    priority = 7;
  }
  else {
    fmt = "evutil_make_socket_nonblocking";
    iVar1 = 0x216;
    priority = 3;
  }
  _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",iVar1,
             "forward_dns_request",1,priority,fmt);
LAB_00106be9:
  if (-1 < __fd) {
    evutil_closesocket(__fd);
  }
  return -1;
}

Assistant:

static int forward_dns_request(struct sockaddr * dest_addr, socklen_t dest_len, const void *data, size_t len)
{
    ssize_t outgoing;
    int rc;
    int fd = -1;

    fd = socket(dest_addr->sa_family, SOCK_DGRAM, IPPROTO_UDP);
    if (fd == -1) {
        log_errno(LOG_ERR, "socket");
        goto fail;
    }

    rc = evutil_make_socket_nonblocking(fd);
    if (rc) {
        log_errno(LOG_ERR, "evutil_make_socket_nonblocking");
        goto fail;
    }

    outgoing = sendto(fd, data, len, 0, dest_addr, dest_len);
    if (outgoing == -1) {
        log_errno(LOG_DEBUG, "sendto: Can't forward packet");
        goto fail;
    }
    else if (outgoing != len) {
        log_error(LOG_DEBUG, "sendto: I was sending %zd bytes, but only %zd were sent.", len, outgoing);
        goto fail;
    }
    return fd;
fail:
    if (fd >= 0) {
        evutil_closesocket(fd);
    }
    return -1;
}